

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O1

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_install_snapshot_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _func_int *p_Var3;
  pointer psVar4;
  long *plVar5;
  _func_int **pp_Var6;
  ulong uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  undefined8 uVar11;
  element_type *peVar12;
  buffer *buf;
  size_t sVar13;
  long lVar14;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  ptr<resp_msg> pVar16;
  ptr<buffer> done_ctx;
  ptr<snapshot_sync_req> sync_req;
  ptr<resp_msg> *resp;
  undefined1 local_88 [32];
  undefined1 local_68 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_68._16_8_ = this;
  if ((*(_func_int **)(in_RDX + 8) == req[9].super_msg_base._vptr_msg_base[1]) &&
     (((ulong)req[2].log_entries_.
              super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) == 0)) {
    if (*(int *)&req[8].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage == 2) {
      become_follower((raft_server *)req);
    }
    else {
      if (*(int *)&req[8].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage == 3) {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar4 != (pointer)0x0) {
          iVar10 = (*(code *)(psVar4->
                             super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr[1].buff_.
                             super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                             ();
          if (1 < iVar10) {
            psVar4 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      ((string *)local_88,
                       "Receive InstallSnapshotRequest from another leader(%d) with same term, there must be a bug, server exits"
                       ,(ulong)*(uint *)(in_RDX + 0x14));
            (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar4,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_install_snapshot_req",0xfb,local_88);
            if ((buffer *)local_88._0_8_ != (buffer *)(local_88 + 0x10)) {
              operator_delete((void *)local_88._0_8_);
            }
          }
        }
        plVar5 = (long *)**(undefined8 **)&req[4].super_msg_base.dst_;
        (**(code **)(*plVar5 + 0x40))(plVar5,0xfffffff6);
        exit(-1);
      }
      restart_election_timer((raft_server *)req);
    }
  }
  p_Var3 = req[9].super_msg_base._vptr_msg_base[1];
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  uVar11 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
  uVar8 = local_68._16_8_;
  *(_func_int ***)local_68._16_8_ = (_func_int **)0x0;
  peVar12 = (element_type *)operator_new(0xb0);
  (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar12->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_001d2270;
  uVar2 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (peVar12->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var3;
  *(undefined4 *)&(peVar12->bg_append_thread_)._M_id._M_thread = 0x11;
  *(undefined4 *)((long)&(peVar12->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
  *(undefined4 *)&peVar12->bg_append_ea_ = uVar1;
  (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_001d22c0;
  peVar12->initialized_ = (atomic<bool>)(char)uVar11;
  *(int3 *)&peVar12->field_0x31 = (int3)((ulong)uVar11 >> 8);
  peVar12->leader_ = (atomic<int>)(int)((ulong)uVar11 >> 0x20);
  _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar12->id_ = 0;
  peVar12->my_priority_ = 0;
  *(undefined1 *)&peVar12->target_priority_ = 0;
  (peVar12->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar12->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar12->votes_responded_ = 0;
  peVar12->votes_granted_ = 0;
  (peVar12->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)((long)&(peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x18)
       = 0;
  *(undefined8 *)((long)&(peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x20)
       = 0;
  *(undefined8 *)((long)&(peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)((long)&(peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  *(undefined8 *)&(peVar12->priority_change_timer_).first_event_fired_ = 0;
  (peVar12->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  (peVar12->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar12->priority_change_timer_).duration_us_ = 0;
  *(undefined4 *)&(peVar12->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (((enable_shared_from_this<nuraft::raft_server> *)(uVar8 + 8))->_M_weak_this).
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar12;
  *(_func_int ***)uVar8 =
       (_func_int **)
       &(peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if ((((ulong)req[2].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x10000) == 0) &&
     (*(_func_int **)(in_RDX + 8) < req[9].super_msg_base._vptr_msg_base[1])) {
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar4 == (pointer)0x0) goto LAB_0018b049;
    iVar10 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr[1].buff_.
                       super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
    _Var15._M_pi = extraout_RDX;
    if (iVar10 < 3) goto LAB_0018b049;
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              ((string *)local_88,
               "received an install snapshot request (%lu) which has lower term than this server (%lu), decline the request"
               ,*(undefined8 *)(in_RDX + 8),req[9].super_msg_base._vptr_msg_base[1]);
    (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar4,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
      ,"handle_install_snapshot_req",0x111,local_88);
    _Var15._M_pi = extraout_RDX_00;
  }
  else {
    plVar5 = *(long **)(in_RDX + 0x38);
    if ((*(long *)(in_RDX + 0x40) - (long)plVar5 == 0x10) && (*(char *)(*plVar5 + 8) == '\x05')) {
      buf = log_entry::get_buf((log_entry *)*plVar5);
      snapshot_sync_req::deserialize((snapshot_sync_req *)local_68,buf);
      if (req[2].super_msg_base._vptr_msg_base <
          (_func_int **)
          ((((ptr<snapshot> *)local_68._0_8_)->
           super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->last_log_idx_)
      {
        bVar9 = handle_snapshot_sync_req((raft_server *)req,(snapshot_sync_req *)local_68._0_8_);
        _Var15._M_pi = extraout_RDX_01;
        if (bVar9) {
          p_Var3 = *(_func_int **)(local_68._0_8_ + 0x10);
          pp_Var6 = *(_func_int ***)uVar8;
          if (((((ptr<snapshot> *)local_68._0_8_)->
               super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ ==
              raw_binary) {
            sVar13 = buffer::size((((ptr<buffer> *)(local_68._0_8_ + 0x18))->
                                  super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr);
            pp_Var6[4] = p_Var3 + sVar13;
            *(undefined1 *)(pp_Var6 + 6) = 1;
            _Var15._M_pi = extraout_RDX_02;
          }
          else {
            pp_Var6[4] = p_Var3;
            *(undefined1 *)(pp_Var6 + 6) = 1;
            if (*(bool *)(local_68._0_8_ + 0x28) == true) {
              buffer::alloc((buffer *)local_88,1);
              buffer::pos((buffer *)local_88._0_8_,0);
              buffer::put((buffer *)local_88._0_8_,'\0');
              buffer::pos((buffer *)local_88._0_8_,0);
              local_68._24_8_ = local_88._0_8_;
              local_68._32_8_ = local_88._8_8_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
                }
              }
              pp_Var6[7] = (_func_int *)local_88._0_8_;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pp_Var6 + 8),
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x20));
              _Var15._M_pi = extraout_RDX_10;
              this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._32_8_;
              goto LAB_0018b021;
            }
          }
        }
      }
      else {
        psVar4 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (psVar4 != (pointer)0x0) {
          iVar10 = (*(code *)(psVar4->
                             super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr[1].buff_.
                             super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                             ();
          if (2 < iVar10) {
            psVar4 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            uVar7 = ((((ptr<snapshot> *)local_68._0_8_)->
                     super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    last_log_idx_;
            pp_Var6 = req[2].super_msg_base._vptr_msg_base;
            lVar14 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
            msg_if_given_abi_cxx11_
                      ((string *)local_88,
                       "received a snapshot (%lu) that is older than current commit idx (%lu), last log idx %lu"
                       ,uVar7,pp_Var6,lVar14 + -1);
            (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar4,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"handle_install_snapshot_req",0x124,local_88);
            if ((buffer *)local_88._0_8_ != (buffer *)(local_88 + 0x10)) {
              operator_delete((void *)local_88._0_8_);
            }
          }
        }
        buffer::alloc((buffer *)local_88,1);
        buffer::pos((buffer *)local_88._0_8_,0);
        buffer::put((buffer *)local_88._0_8_,'\0');
        buffer::pos((buffer *)local_88._0_8_,0);
        pp_Var6 = *(_func_int ***)uVar8;
        local_68._40_8_ = local_88._0_8_;
        local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_88._8_8_ + 8) = *(_Atomic_word *)(local_88._8_8_ + 8) + 1;
          }
        }
        pp_Var6[7] = (_func_int *)local_88._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pp_Var6 + 8),&local_38);
        _Var15._M_pi = extraout_RDX_06;
        this_00._M_pi = local_38._M_pi;
LAB_0018b021:
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
          _Var15._M_pi = extraout_RDX_07;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
          _Var15._M_pi = extraout_RDX_08;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        _Var15._M_pi = extraout_RDX_09;
      }
      goto LAB_0018b049;
    }
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar4 == (pointer)0x0) goto LAB_0018b049;
    iVar10 = (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr[1].buff_.
                       super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
    _Var15._M_pi = extraout_RDX_03;
    if (iVar10 < 3) goto LAB_0018b049;
    psVar4 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              ((string *)local_88,
               "Receive an invalid InstallSnapshotRequest due to bad log entries or bad log entry value"
              );
    (*(code *)(psVar4->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar4,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
      ,"handle_install_snapshot_req",0x119,local_88);
    _Var15._M_pi = extraout_RDX_04;
  }
  if ((buffer *)local_88._0_8_ != (buffer *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_);
    _Var15._M_pi = extraout_RDX_05;
  }
LAB_0018b049:
  pVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var15._M_pi;
  pVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar8;
  return (ptr<resp_msg>)pVar16.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_install_snapshot_req(req_msg& req) {
    if (req.get_term() == state_->get_term() && !catching_up_) {
        if (role_ == srv_role::candidate) {
            become_follower();

        } else if (role_ == srv_role::leader) {
            // LCOV_EXCL_START
            p_er( "Receive InstallSnapshotRequest from another leader(%d) "
                  "with same term, there must be a bug, server exits",
                  req.get_src() );
            ctx_->state_mgr_->system_exit
                ( raft_err::N10_leader_receive_InstallSnapshotRequest );
            ::exit(-1);
            return ptr<resp_msg>();
            // LCOV_EXCL_STOP

        } else {
            restart_election_timer();
        }
    }

    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::install_snapshot_response,
                           id_,
                           req.get_src(),
                           log_store_->next_slot() );

    if (!catching_up_ && req.get_term() < state_->get_term()) {
        p_wn("received an install snapshot request (%" PRIu64 ") which has lower term "
             "than this server (%" PRIu64 "), decline the request",
             req.get_term(), state_->get_term());
        return resp;
    }

    std::vector<ptr<log_entry>>& entries(req.log_entries());
    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::snp_sync_req ) {
        p_wn("Receive an invalid InstallSnapshotRequest due to "
             "bad log entries or bad log entry value");
        return resp;
    }

    ptr<snapshot_sync_req> sync_req =
        snapshot_sync_req::deserialize(entries[0]->get_buf());
    if (sync_req->get_snapshot().get_last_log_idx() <= quick_commit_index_) {
        p_wn( "received a snapshot (%" PRIu64 ") that is older than "
              "current commit idx (%" PRIu64 "), last log idx %" PRIu64,
              sync_req->get_snapshot().get_last_log_idx(),
              quick_commit_index_.load(),
              log_store_->next_slot() - 1);
        // Put dummy CTX to end the snapshot sync.
        ptr<buffer> done_ctx = buffer::alloc(1);
        done_ctx->pos(0);
        done_ctx->put((byte)0);
        done_ctx->pos(0);
        resp->set_ctx(done_ctx);
        return resp;
    }

    if (handle_snapshot_sync_req(*sync_req)) {
        if (sync_req->get_snapshot().get_type() == snapshot::raw_binary) {
            // LCOV_EXCL_START
            // Raw binary: add received byte to offset.
            resp->accept(sync_req->get_offset() + sync_req->get_data().size());
            // LCOV_EXCL_STOP

        } else {
            // Object type: add one (next object index).
            resp->accept(sync_req->get_offset());
            if (sync_req->is_done()) {
                // TODO: check if there is missing object.
                // Add a context buffer to inform installation is done.
                ptr<buffer> done_ctx = buffer::alloc(1);
                done_ctx->pos(0);
                done_ctx->put((byte)0);
                done_ctx->pos(0);
                resp->set_ctx(done_ctx);
            }
        }
    }

    return resp;
}